

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

obj * shop_object(xchar x,xchar y)

{
  obj *poVar1;
  level *lev;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  monst *mtmp;
  
  lev = level;
  pcVar4 = in_rooms(level,x,y,0x12);
  mtmp = shop_keeper(lev,*pcVar4);
  if ((mtmp != (monst *)0x0) && (iVar3 = inhishop(mtmp), iVar3 != 0)) {
    for (poVar1 = level->objects[x][y]; poVar1 != (obj *)0x0; poVar1 = (poVar1->v).v_nexthere) {
      if (poVar1->oclass != '\f') {
        bVar2 = costly_spot(x,y);
        if (bVar2 == '\0') {
          return (obj *)0x0;
        }
        if ((~*(uint *)&mtmp->field_0x60 & 0x440000) != 0) {
          return (obj *)0x0;
        }
        if ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0) {
          return poVar1;
        }
        return (obj *)0x0;
      }
    }
  }
  return (obj *)0x0;
}

Assistant:

struct obj *shop_object(xchar x, xchar y)
{
    struct obj *otmp;
    struct monst *shkp;

    if (!(shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE))) || !inhishop(shkp))
	return NULL;

    for (otmp = level->objects[x][y]; otmp; otmp = otmp->nexthere)
	if (otmp->oclass != COIN_CLASS)
	    break;
    /* note: otmp might have ->no_charge set, but that's ok */
    return (otmp && costly_spot(x, y) && NOTANGRY(shkp)
	    && shkp->mcanmove && !shkp->msleeping)
		? otmp : NULL;
}